

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTDMT_CCtx * ZSTDMT_createCCtx_advanced(uint nbWorkers,ZSTD_customMem cMem)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ZSTDMT_CCtx *mtctx;
  POOL_ctx *pPVar6;
  ZSTDMT_jobDescription *pZVar7;
  ZSTDMT_bufferPool *pZVar8;
  ZSTDMT_CCtxPool *pZVar9;
  uint nbWorkers_00;
  char *__assertion;
  undefined1 auVar10 [32];
  uint local_24;
  
  local_24 = nbWorkers + 2;
  if (nbWorkers != 0) {
    nbWorkers_00 = 200;
    if (nbWorkers < 200) {
      nbWorkers_00 = nbWorkers;
    }
    if (((cMem.customFree != (ZSTD_freeFunction)0x0) ==
         (cMem.customAlloc != (ZSTD_allocFunction)0x0)) &&
       (mtctx = (ZSTDMT_CCtx *)ZSTD_calloc(0x380,cMem), mtctx != (ZSTDMT_CCtx *)0x0)) {
      ZSTDMT_CCtxParam_setNbWorkers(&mtctx->params,nbWorkers_00);
      (mtctx->cMem).customAlloc = cMem.customAlloc;
      (mtctx->cMem).customFree = cMem.customFree;
      (mtctx->cMem).opaque = cMem.opaque;
      mtctx->allJobsCompleted = 1;
      pPVar6 = POOL_create_advanced((ulong)nbWorkers_00,0,cMem);
      mtctx->factory = pPVar6;
      pZVar7 = ZSTDMT_createJobsTable(&local_24,cMem);
      mtctx->jobs = pZVar7;
      if (local_24 == 0) {
        __assertion = "nbJobs > 0";
      }
      else {
        if ((local_24 & local_24 - 1) == 0) {
          mtctx->jobIDMask = local_24 - 1;
          pZVar8 = ZSTDMT_createBufferPool(nbWorkers_00,cMem);
          mtctx->bufPool = pZVar8;
          pZVar9 = ZSTDMT_createCCtxPool(nbWorkers_00,cMem);
          mtctx->cctxPool = pZVar9;
          pZVar8 = ZSTDMT_createBufferPool(nbWorkers_00,cMem);
          if (pZVar8 != (ZSTDMT_bufferPool *)0x0) {
            ZSTDMT_setBufferSize(pZVar8,0);
          }
          mtctx->seqPool = pZVar8;
          memset(&mtctx->serial,0,0x200);
          iVar2 = pthread_mutex_init((pthread_mutex_t *)&mtctx->serial,(pthread_mutexattr_t *)0x0);
          iVar3 = pthread_cond_init((pthread_cond_t *)&(mtctx->serial).cond,
                                    (pthread_condattr_t *)0x0);
          iVar4 = pthread_mutex_init((pthread_mutex_t *)&(mtctx->serial).ldmWindowMutex,
                                     (pthread_mutexattr_t *)0x0);
          iVar5 = pthread_cond_init((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,
                                    (pthread_condattr_t *)0x0);
          (mtctx->roundBuff).pos = 0;
          (mtctx->roundBuff).buffer = (BYTE *)0x0;
          (mtctx->roundBuff).capacity = 0;
          auVar10._0_8_ = -(ulong)(mtctx->factory == (POOL_ctx *)0x0);
          auVar10._8_8_ = -(ulong)(mtctx->jobs == (ZSTDMT_jobDescription *)0x0);
          auVar10._16_8_ = -(ulong)(mtctx->bufPool == (ZSTDMT_bufferPool *)0x0);
          bVar1 = mtctx->cctxPool == (ZSTDMT_CCtxPool *)0x0;
          auVar10._24_8_ = -(ulong)bVar1;
          if ((((((auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') || SUB321(auVar10 >> 0xbf,0) != '\0') || bVar1)
              || mtctx->seqPool == (ZSTDMT_seqPool *)0x0) ||
              ((iVar5 != 0 || iVar4 != 0) || (iVar3 != 0 || iVar2 != 0))) {
            ZSTDMT_freeCCtx(mtctx);
            return (ZSTDMT_CCtx *)0x0;
          }
          return mtctx;
        }
        __assertion = "(nbJobs & (nbJobs - 1)) == 0";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4de2,
                    "ZSTDMT_CCtx *ZSTDMT_createCCtx_advanced_internal(unsigned int, ZSTD_customMem)"
                   );
    }
  }
  return (ZSTDMT_CCtx *)0x0;
}

Assistant:

ZSTDMT_CCtx* ZSTDMT_createCCtx_advanced(unsigned nbWorkers, ZSTD_customMem cMem)
{
#ifdef ZSTD_MULTITHREAD
    return ZSTDMT_createCCtx_advanced_internal(nbWorkers, cMem);
#else
    (void)nbWorkers;
    (void)cMem;
    return NULL;
#endif
}